

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsMouseClicked(ImGuiMouseButton button,bool repeat)

{
  float t1;
  float repeat_delay;
  int iVar1;
  bool bVar2;
  
  if (4 < (uint)button) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*g.IO.MouseDown)))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x115c,"bool ImGui::IsMouseClicked(ImGuiMouseButton, bool)");
  }
  t1 = (GImGui->IO).MouseDownDuration[(uint)button];
  bVar2 = true;
  if ((t1 != 0.0) || (NAN(t1))) {
    if ((repeat) &&
       ((repeat_delay = (GImGui->IO).KeyRepeatDelay, repeat_delay < t1 &&
        (iVar1 = CalcTypematicRepeatAmount
                           (t1 - (GImGui->IO).DeltaTime,t1,repeat_delay,
                            (GImGui->IO).KeyRepeatRate * 0.5), 0 < iVar1)))) {
      return true;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::IsMouseClicked(ImGuiMouseButton button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;

    if (repeat && t > g.IO.KeyRepeatDelay)
    {
        // FIXME: 2019/05/03: Our old repeat code was wrong here and led to doubling the repeat rate, which made it an ok rate for repeat on mouse hold.
        int amount = CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate * 0.50f);
        if (amount > 0)
            return true;
    }
    return false;
}